

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Escape::CGraph::sortById(CGraph *this)

{
  VertexIdx *pVVar1;
  VertexIdx *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  lVar5 = this->nVertices;
  if (0 < lVar5) {
    lVar7 = 0;
    do {
      lVar3 = this->offsets[lVar7];
      lVar4 = this->offsets[lVar7 + 1];
      if (lVar3 != lVar4) {
        pVVar1 = this->nbors + lVar4;
        pVVar2 = this->nbors + lVar3;
        uVar6 = lVar4 * 8 + lVar3 * -8 >> 3;
        lVar5 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::__introsort_loop<long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pVVar2,pVVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(pVVar2,pVVar1);
        lVar5 = this->nVertices;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar5);
  }
  return;
}

Assistant:

void CGraph::sortById() const {
    for (VertexIdx i = 0; i < nVertices; i++)
        std::sort(nbors + offsets[i], nbors + offsets[i + 1]);
}